

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

htab_hash_t macro_hash(macro_t macro,void *arg)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint8_t *v;
  ulong *__s;
  ulong uVar12;
  
  __s = (ulong *)macro->id->repr;
  uVar9 = strlen((char *)__s);
  uVar10 = uVar9 + 0x42;
  for (; 0xf < uVar9; uVar9 = uVar9 - 0x10) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *__s;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = __s[1];
    __s = __s + 2;
    uVar10 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar7,8) +
             SUB168(ZEXT816(0x288eea216831e6a7) * auVar7,0) ^
             SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar6,8) +
             SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar6,0) ^ uVar10;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    uVar10 = SUB168(auVar2 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar2 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar10;
  }
  if (7 < uVar9) {
    uVar9 = uVar9 - 8;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *__s;
    __s = __s + 1;
    uVar10 = uVar10 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar8,8) +
                      SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar8,0);
  }
  if (uVar9 != 0) {
    if (uVar9 < 4) {
      uVar12 = 0;
      uVar11 = 0;
    }
    else {
      uVar12 = 4;
      uVar11 = (ulong)(uint)*__s << 0x20;
    }
    if (uVar12 < uVar9) {
      do {
        pbVar1 = (byte *)((long)__s + uVar12);
        uVar12 = uVar12 + 1;
        uVar11 = uVar11 >> 8 | (ulong)*pbVar1 << 0x38;
      } while (uVar9 != uVar12);
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar11;
    uVar10 = uVar10 ^ SUB168(auVar3 * ZEXT816(0x288eea216831e6a7),8) +
                      SUB168(auVar3 * ZEXT816(0x288eea216831e6a7),0);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar10;
  uVar10 = SUB168(auVar4 * ZEXT816(0x65862b62bdf5ef4d),8) +
           SUB168(auVar4 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar10;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar10;
  return (uint)uVar10 ^
         SUB164(auVar5 * ZEXT816(0x288eea216831e6a7),8) +
         SUB164(auVar5 * ZEXT816(0x288eea216831e6a7),0);
}

Assistant:

static htab_hash_t macro_hash (macro_t macro, void *arg MIR_UNUSED) {
  return (htab_hash_t) mir_hash (macro->id->repr, strlen (macro->id->repr), 0x42);
}